

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddUtil.c
# Opt level: O3

int Cudd_zddPrintCover(DdManager *zdd,DdNode *node)

{
  int iVar1;
  undefined1 auVar2 [16];
  int *list;
  ulong uVar3;
  long lVar4;
  int iVar6;
  undefined1 auVar5 [16];
  undefined1 auVar7 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int iVar11;
  long lVar8;
  
  iVar1 = zdd->sizeZ;
  uVar3 = (ulong)iVar1;
  iVar6 = 0;
  if ((uVar3 & 1) == 0) {
    list = (int *)malloc(uVar3 * 4);
    auVar2 = _DAT_0094e250;
    if (list == (int *)0x0) {
      zdd->errorCode = CUDD_MEMORY_OUT;
      iVar6 = 0;
    }
    else {
      if (0 < iVar1) {
        lVar4 = uVar3 - 1;
        auVar5._8_4_ = (int)lVar4;
        auVar5._0_8_ = lVar4;
        auVar5._12_4_ = (int)((ulong)lVar4 >> 0x20);
        lVar4 = 0;
        auVar5 = auVar5 ^ _DAT_0094e250;
        auVar7 = _DAT_0094f530;
        auVar9 = _DAT_0094e240;
        do {
          auVar10 = auVar9 ^ auVar2;
          iVar6 = auVar5._4_4_;
          if ((bool)(~(auVar10._4_4_ == iVar6 && auVar5._0_4_ < auVar10._0_4_ ||
                      iVar6 < auVar10._4_4_) & 1)) {
            *(undefined4 *)((long)list + lVar4) = 3;
          }
          if ((auVar10._12_4_ != auVar5._12_4_ || auVar10._8_4_ <= auVar5._8_4_) &&
              auVar10._12_4_ <= auVar5._12_4_) {
            *(undefined4 *)((long)list + lVar4 + 4) = 3;
          }
          auVar10 = auVar7 ^ auVar2;
          iVar11 = auVar10._4_4_;
          if (iVar11 <= iVar6 && (iVar11 != iVar6 || auVar10._0_4_ <= auVar5._0_4_)) {
            *(undefined4 *)((long)list + lVar4 + 8) = 3;
            *(undefined4 *)((long)list + lVar4 + 0xc) = 3;
          }
          lVar8 = auVar9._8_8_;
          auVar9._0_8_ = auVar9._0_8_ + 4;
          auVar9._8_8_ = lVar8 + 4;
          lVar8 = auVar7._8_8_;
          auVar7._0_8_ = auVar7._0_8_ + 4;
          auVar7._8_8_ = lVar8 + 4;
          lVar4 = lVar4 + 0x10;
        } while ((ulong)(iVar1 + 3U >> 2) << 4 != lVar4);
      }
      zddPrintCoverAux(zdd,node,0,list);
      free(list);
      iVar6 = 1;
    }
  }
  return iVar6;
}

Assistant:

int
Cudd_zddPrintCover(
  DdManager * zdd,
  DdNode * node)
{
    int         i, size;
    int         *list;

    size = (int)zdd->sizeZ;
    if (size % 2 != 0) return(0); /* number of variables should be even */
    list = ABC_ALLOC(int, size);
    if (list == NULL) {
        zdd->errorCode = CUDD_MEMORY_OUT;
        return(0);
    }
    for (i = 0; i < size; i++) list[i] = 3; /* bogus value should disappear */
    zddPrintCoverAux(zdd, node, 0, list);
    ABC_FREE(list);
    return(1);

}